

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

size_t prt_terrain(wchar_t row,wchar_t col)

{
  uint8_t attr;
  ushort uVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  trap_kind_conflict *ptVar2;
  _Bool _Var3;
  feature *pfVar4;
  trap *ptVar5;
  char *str;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint8_t *puVar9;
  char buf [30];
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pfVar4 = square_feat(cave,grid);
  grid_00.x = (player->grid).x;
  grid_00.y = (player->grid).y;
  ptVar5 = square_trap(cave,grid_00);
  if (ptVar5 != (trap *)0x0) {
    grid_01.x = (player->grid).x;
    grid_01.y = (player->grid).y;
    _Var3 = square_isinvis(cave,grid_01);
    if (!_Var3) {
      my_strcpy(buf,ptVar5->kind->name,0x1e);
      puVar9 = &ptVar5->kind->d_attr;
      goto LAB_001b7aba;
    }
  }
  my_strcpy(buf,pfVar4->name,0x1e);
  puVar9 = &pfVar4->d_attr;
LAB_001b7aba:
  attr = *puVar9;
  my_strcap(buf);
  str = format("%s ",buf);
  c_put_str(attr,str,row,col);
  ptVar2 = trap_info;
  uVar1 = z_info->trap_max;
  uVar7 = 0;
  for (lVar8 = 0; pfVar4 = f_info, (ulong)uVar1 * 0x80 != lVar8; lVar8 = lVar8 + 0x80) {
    sVar6 = strlen(*(char **)(ptVar2->flags + lVar8 + -0x68));
    if (uVar7 < sVar6) {
      uVar7 = sVar6;
    }
  }
  for (lVar8 = 0; lVar8 != 0xaf0; lVar8 = lVar8 + 0x70) {
    sVar6 = strlen(*(char **)(pfVar4->flags + lVar8 + -0x23));
    if (uVar7 < sVar6) {
      uVar7 = sVar6;
    }
  }
  return (long)((int)uVar7 + 1);
}

Assistant:

static size_t prt_terrain(int row, int col)
{
	struct feature *feat = square_feat(cave, player->grid);
	struct trap *trap = square_trap(cave, player->grid);
	char buf[30];
	uint8_t attr;

	if (trap && !square_isinvis(cave, player->grid)) {
		my_strcpy(buf, trap->kind->name, sizeof(buf));
		attr = trap->kind->d_attr;
	} else {
		my_strcpy(buf, feat->name, sizeof(buf));
		attr = feat->d_attr;
	}
	my_strcap(buf);
	c_put_str(attr, format("%s ", buf), row, col);

	return longest_terrain_name() + 1;
}